

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextInitialize(ImGuiContext *ctx)

{
  int *piVar1;
  int iVar2;
  ImGuiSettingsHandler *pIVar3;
  ImU32 IVar4;
  ImGuiDockContext *pIVar5;
  ImGuiSettingsHandler *__dest;
  int iVar6;
  int iVar7;
  
  if (GImGui != (ImGuiContext *)0x0) {
    piVar1 = &(GImGui->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
  }
  pIVar5 = (ImGuiDockContext *)(*GImAllocatorAllocFunc)(0x38,GImAllocatorUserData);
  (pIVar5->Nodes).Data.Size = 0;
  (pIVar5->Nodes).Data.Capacity = 0;
  (pIVar5->Nodes).Data.Data = (ImGuiStoragePair *)0x0;
  (pIVar5->Requests).Size = 0;
  (pIVar5->Requests).Capacity = 0;
  (pIVar5->Requests).Data = (ImGuiDockRequest *)0x0;
  (pIVar5->SettingsNodes).Size = 0;
  (pIVar5->SettingsNodes).Capacity = 0;
  (pIVar5->SettingsNodes).Data = (ImGuiDockNodeSettings *)0x0;
  pIVar5->WantFullRebuild = false;
  ctx->DockContext = pIVar5;
  IVar4 = ImHashStr("Docking",0,0);
  iVar7 = (ctx->SettingsHandlers).Size;
  iVar2 = (ctx->SettingsHandlers).Capacity;
  if (iVar7 == iVar2) {
    iVar7 = iVar7 + 1;
    if (iVar2 == 0) {
      iVar6 = 8;
    }
    else {
      iVar6 = iVar2 / 2 + iVar2;
    }
    if (iVar7 < iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiSettingsHandler *)
               (*GImAllocatorAllocFunc)((long)iVar7 * 0x30,GImAllocatorUserData);
      pIVar3 = (ctx->SettingsHandlers).Data;
      if (pIVar3 != (ImGuiSettingsHandler *)0x0) {
        memcpy(__dest,pIVar3,(long)(ctx->SettingsHandlers).Size * 0x30);
        pIVar3 = (ctx->SettingsHandlers).Data;
        if ((pIVar3 != (ImGuiSettingsHandler *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (ctx->SettingsHandlers).Data = __dest;
      (ctx->SettingsHandlers).Capacity = iVar7;
    }
  }
  pIVar3 = (ctx->SettingsHandlers).Data;
  iVar7 = (ctx->SettingsHandlers).Size;
  pIVar3[iVar7].TypeName = "Docking";
  pIVar3[iVar7].TypeHash = IVar4;
  *(undefined4 *)&pIVar3[iVar7].field_0xc = 0;
  pIVar3[iVar7].ReadOpenFn = DockSettingsHandler_ReadOpen;
  pIVar3[iVar7].ReadLineFn = DockSettingsHandler_ReadLine;
  pIVar3[iVar7].WriteAllFn = DockSettingsHandler_WriteAll;
  pIVar3[iVar7].UserData = (void *)0x0;
  (ctx->SettingsHandlers).Size = (ctx->SettingsHandlers).Size + 1;
  return;
}

Assistant:

void ImGui::DockContextInitialize(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    IM_ASSERT(g.DockContext == NULL);
    g.DockContext = IM_NEW(ImGuiDockContext)();

    // Add .ini handle for persistent docking data
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Docking";
    ini_handler.TypeHash = ImHashStr("Docking");
    ini_handler.ReadOpenFn = DockSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = DockSettingsHandler_ReadLine;
    ini_handler.WriteAllFn = DockSettingsHandler_WriteAll;
    g.SettingsHandlers.push_back(ini_handler);
}